

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  bool bVar2;
  Message *pMVar3;
  Message *pMVar4;
  uint uVar5;
  bool bVar6;
  Message buffer;
  Message m;
  string local_58;
  String error_message;
  String local_28;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStderr();
  Message::Message(&buffer);
  pMVar3 = Message::operator<<(&buffer,(char (*) [13])"Death test: ");
  m.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )this->statement_;
  pMVar3 = Message::operator<<(pMVar3,(char **)&m);
  Message::operator<<(pMVar3,(char (*) [2])0x11c9c7);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      bVar2 = RE::PartialMatch(error_message.c_str_,this->regex_);
      bVar6 = true;
      if (bVar2) goto LAB_00111846;
      pMVar3 = Message::operator<<(&buffer,(char (*) [47])
                                           "    Result: died but not with expected error.\n");
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"  Expected: ");
      local_28.c_str_ = *(char **)this->regex_;
      pMVar3 = Message::operator<<(pMVar3,&local_28.c_str_);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x11c9c7);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"Actual msg:\n");
      String::operator_cast_to_string(&local_58,&error_message);
      FormatDeathTestOutput((string *)&m,&local_58);
      Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&m);
      break;
    }
    pMVar3 = Message::operator<<(&buffer,(char (*) [51])
                                         "    Result: died but not with expected exit code:\n");
    pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"            ");
    uVar1 = this->status_;
    Message::Message(&m);
    uVar5 = uVar1 & 0x7f;
    if (uVar5 == 0) {
      pMVar4 = Message::operator<<(&m,(char (*) [25])"Exited with exit status ");
      local_58._M_dataplus._M_p._0_4_ = uVar1 >> 8 & 0xff;
      Message::operator<<(pMVar4,(int *)&local_58);
    }
    else if (0x1ffffff < (int)(uVar5 * 0x1000000 + 0x1000000)) {
      pMVar4 = Message::operator<<(&m,(char (*) [22])"Terminated by signal ");
      local_58._M_dataplus._M_p._0_4_ = uVar5;
      Message::operator<<(pMVar4,(int *)&local_58);
    }
    if ((char)uVar1 < '\0') {
      Message::operator<<(&m,(char (*) [15])" (core dumped)");
    }
    StringStreamToString((internal *)&local_28,(stringstream *)m.ss_.ptr_);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&m.ss_);
    pMVar3 = Message::operator<<(pMVar3,&local_28);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x11c9c7);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"Actual msg:\n");
    String::operator_cast_to_string(&local_58,&error_message);
    FormatDeathTestOutput((string *)&m,&local_58);
    Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &m);
    std::__cxx11::string::~string((string *)&m);
    std::__cxx11::string::~string((string *)&local_58);
    String::~String(&local_28);
    goto LAB_00111844;
  case LIVED:
    pMVar3 = Message::operator<<(&buffer,(char (*) [28])"    Result: failed to die.\n");
    pMVar3 = Message::operator<<(pMVar3,(char (*) [13])" Error msg:\n");
    String::operator_cast_to_string(&local_58,&error_message);
    FormatDeathTestOutput((string *)&m,&local_58);
    Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &m);
    break;
  case RETURNED:
    pMVar3 = Message::operator<<(&buffer,(char (*) [47])
                                         "    Result: illegal return in test statement.\n");
    pMVar3 = Message::operator<<(pMVar3,(char (*) [13])" Error msg:\n");
    String::operator_cast_to_string(&local_58,&error_message);
    FormatDeathTestOutput((string *)&m,&local_58);
    Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &m);
    break;
  case THREW:
    pMVar3 = Message::operator<<(&buffer,(char (*) [33])"    Result: threw an exception.\n");
    pMVar3 = Message::operator<<(pMVar3,(char (*) [13])" Error msg:\n");
    String::operator_cast_to_string(&local_58,&error_message);
    FormatDeathTestOutput((string *)&m,&local_58);
    Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &m);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&m,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x213);
    std::operator<<((ostream *)&std::cerr,
                    "DeathTest::Passed somehow called before conclusion of test");
    GTestLog::~GTestLog((GTestLog *)&m);
    goto LAB_00111844;
  }
  std::__cxx11::string::~string((string *)&m);
  std::__cxx11::string::~string((string *)&local_58);
LAB_00111844:
  bVar6 = false;
LAB_00111846:
  StringStreamToString((internal *)&m,(stringstream *)buffer.ss_.ptr_);
  DeathTest::set_last_death_test_message((String *)&m);
  String::~String((String *)&m);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&buffer.ss_);
  String::~String(&error_message);
  return bVar6;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const String error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}